

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeSetNumCols(Vdbe *p,int nResColumn)

{
  sqlite3 *db_00;
  Mem *pMVar1;
  sqlite3 *db;
  int n;
  int nResColumn_local;
  Vdbe *p_local;
  
  db_00 = p->db;
  if (p->nResColumn != 0) {
    releaseMemArray(p->aColName,(uint)p->nResColumn * 5);
    sqlite3DbFree(db_00,p->aColName);
  }
  p->nResColumn = (u16)nResColumn;
  pMVar1 = (Mem *)sqlite3DbMallocRawNN(db_00,(long)(nResColumn * 5) * 0x38);
  p->aColName = pMVar1;
  if (p->aColName != (Mem *)0x0) {
    initMemArray(p->aColName,nResColumn * 5,db_00,1);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeSetNumCols(Vdbe *p, int nResColumn){
  int n;
  sqlite3 *db = p->db;

  if( p->nResColumn ){
    releaseMemArray(p->aColName, p->nResColumn*COLNAME_N);
    sqlite3DbFree(db, p->aColName);
  }
  n = nResColumn*COLNAME_N;
  p->nResColumn = (u16)nResColumn;
  p->aColName = (Mem*)sqlite3DbMallocRawNN(db, sizeof(Mem)*n );
  if( p->aColName==0 ) return;
  initMemArray(p->aColName, n, db, MEM_Null);
}